

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O2

void __thiscall FormatterTest_AutoArgIndex_Test::TestBody(FormatterTest_AutoArgIndex_Test *this)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  int *piVar3;
  char *pcVar4;
  char *in_R9;
  AssertHelper local_100;
  AssertionResult gtest_ar;
  string gtest_expected_message;
  undefined8 local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  local_100.data_._0_1_ = 0x61;
  local_c8._0_4_ = CONCAT31(local_c8._1_3_,0x62);
  local_c8._7_1_ = 99;
  pbVar2 = &gtest_expected_message;
  fmt::v5::format<char[7],char,char,char>
            (pbVar2,(v5 *)0x1f1a50,(char (*) [7])&local_100,(char *)&local_c8,
             (char *)((long)&local_c8 + 7),in_R9);
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"abc\"","format(\"{}{}{}\", \'a\', \'b\', \'c\')",
             (char (*) [4])0x1e6e09,pbVar2);
  std::__cxx11::string::~string((string *)&gtest_expected_message);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1f94d9;
    }
    else {
      pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x343,(char *)pbVar2);
    testing::internal::AssertHelper::operator=(&local_100,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,
               "cannot switch from manual to automatic argument indexing",(allocator *)&local_100);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_100.data_._0_1_ = 0x61;
      local_c8._0_4_ = CONCAT31(local_c8._1_3_,0x62);
      fmt::v5::format<char[6],char,char>
                (&local_40,(v5 *)"{0}{}",(char (*) [6])&local_100,(char *)&local_c8,(char *)pbVar2);
      std::__cxx11::string::~string((string *)&local_40);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [107])
               "Expected: format(\"{0}{}\", \'a\', \'b\') throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar4 = "";
  }
  else {
    pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_100,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x345,pcVar4);
  testing::internal::AssertHelper::operator=(&local_100,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper(&local_100);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,
               "cannot switch from automatic to manual argument indexing",(allocator *)&local_100);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_100.data_._0_1_ = 0x61;
      local_c8._0_4_ = CONCAT31(local_c8._1_3_,0x62);
      fmt::v5::format<char[6],char,char>
                (&local_60,(v5 *)"{}{0}",(char (*) [6])&local_100,(char *)&local_c8,pcVar4);
      std::__cxx11::string::~string((string *)&local_60);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [107])
               "Expected: format(\"{}{0}\", \'a\', \'b\') throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    piVar3 = (int *)0x1f94d9;
  }
  else {
    piVar3 = (int *)((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_100,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x347,(char *)piVar3);
  testing::internal::AssertHelper::operator=(&local_100,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper(&local_100);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_100.data_ = (AssertHelperData *)0x3ff3c083126e978d;
  local_c8._0_4_ = 2;
  pbVar2 = &gtest_expected_message;
  fmt::v5::format<char[7],double,int>
            (pbVar2,(v5 *)"{:.{}}",(char (*) [7])&local_100,(double *)&local_c8,piVar3);
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"1.2\"","format(\"{:.{}}\", 1.2345, 2)",(char (*) [4])0x1f167d,
             pbVar2);
  std::__cxx11::string::~string((string *)&gtest_expected_message);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1f94d9;
    }
    else {
      pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x348,(char *)pbVar2);
    testing::internal::AssertHelper::operator=(&local_100,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,
               "cannot switch from manual to automatic argument indexing",(allocator *)&local_100);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_100.data_ = (AssertHelperData *)0x3ff3c083126e978d;
      local_c8._0_4_ = 2;
      fmt::v5::format<char[8],double,int>
                (&local_80,(v5 *)"{0}:.{}",(char (*) [8])&local_100,(double *)&local_c8,
                 (int *)pbVar2);
      std::__cxx11::string::~string((string *)&local_80);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [110])
               "Expected: format(\"{0}:.{}\", 1.2345, 2) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    piVar3 = (int *)0x1f94d9;
  }
  else {
    piVar3 = (int *)((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_100,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x34a,(char *)piVar3);
  testing::internal::AssertHelper::operator=(&local_100,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper(&local_100);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,
               "cannot switch from automatic to manual argument indexing",(allocator *)&local_100);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_100.data_ = (AssertHelperData *)0x3ff3c083126e978d;
      local_c8._0_4_ = 2;
      fmt::v5::format<char[8],double,int>
                (&local_a0,(v5 *)"{:.{0}}",(char (*) [8])&local_100,(double *)&local_c8,piVar3);
      std::__cxx11::string::~string((string *)&local_a0);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [110])
               "Expected: format(\"{:.{0}}\", 1.2345, 2) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar4 = "";
  }
  else {
    pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_100,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x34c,pcVar4);
  testing::internal::AssertHelper::operator=(&local_100,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper(&local_100);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"argument index out of range",
               (allocator *)&local_100);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::v5::format<char[3]>(&local_c0,(char (*) [3])0x1f0c36);
      std::__cxx11::string::~string((string *)&local_c0);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [94])
               "Expected: format(\"{}\") throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar4 = "";
  }
  else {
    pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_100,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x34d,pcVar4);
  testing::internal::AssertHelper::operator=(&local_100,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper(&local_100);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(FormatterTest, AutoArgIndex) {
  EXPECT_EQ("abc", format("{}{}{}", 'a', 'b', 'c'));
  EXPECT_THROW_MSG(format("{0}{}", 'a', 'b'),
      format_error, "cannot switch from manual to automatic argument indexing");
  EXPECT_THROW_MSG(format("{}{0}", 'a', 'b'),
      format_error, "cannot switch from automatic to manual argument indexing");
  EXPECT_EQ("1.2", format("{:.{}}", 1.2345, 2));
  EXPECT_THROW_MSG(format("{0}:.{}", 1.2345, 2),
      format_error, "cannot switch from manual to automatic argument indexing");
  EXPECT_THROW_MSG(format("{:.{0}}", 1.2345, 2),
      format_error, "cannot switch from automatic to manual argument indexing");
  EXPECT_THROW_MSG(format("{}"), format_error, "argument index out of range");
}